

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileHelper.h
# Opt level: O3

void __thiscall Assimp::XFile::Scene::~Scene(Scene *this)

{
  Node *this_00;
  Mesh *this_01;
  Animation *this_02;
  bool bVar1;
  pointer ppMVar2;
  ulong uVar3;
  ulong uVar4;
  pointer ppAVar5;
  
  this_00 = this->mRootNode;
  if (this_00 != (Node *)0x0) {
    Node::~Node(this_00);
  }
  operator_delete(this_00);
  this->mRootNode = (Node *)0x0;
  ppMVar2 = (this->mGlobalMeshes).
            super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mGlobalMeshes).
      super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      this_01 = ppMVar2[uVar3];
      if (this_01 != (Mesh *)0x0) {
        Mesh::~Mesh(this_01);
      }
      operator_delete(this_01);
      ppMVar2 = (this->mGlobalMeshes).
                super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar4 < (ulong)((long)(this->mGlobalMeshes).
                                    super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3)
      ;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  ppAVar5 = (this->mAnims).
            super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mAnims).
      super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar5) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      this_02 = ppAVar5[uVar3];
      if (this_02 != (Animation *)0x0) {
        Animation::~Animation(this_02);
      }
      operator_delete(this_02);
      ppAVar5 = (this->mAnims).
                super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = uVar4 < (ulong)((long)(this->mAnims).
                                    super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5 >> 3)
      ;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  if (ppAVar5 != (pointer)0x0) {
    operator_delete(ppAVar5);
  }
  std::vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>::~vector
            (&this->mGlobalMaterials);
  ppMVar2 = (this->mGlobalMeshes).
            super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppMVar2 != (pointer)0x0) {
    operator_delete(ppMVar2);
    return;
  }
  return;
}

Assistant:

~Scene() {
        delete mRootNode;
        mRootNode = nullptr;
        for (unsigned int a = 0; a < mGlobalMeshes.size(); ++a ) {
            delete mGlobalMeshes[a];
        }
        for (unsigned int a = 0; a < mAnims.size(); ++a ) {
            delete mAnims[a];
        }
    }